

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O0

cio_error cio_server_socket_bind(cio_server_socket *server_socket,cio_socket_address *endpoint)

{
  _Bool _Var1;
  int iVar2;
  int *piVar3;
  int ret;
  socklen_t addr_len;
  sockaddr *addr;
  cio_error err;
  cio_socket_address *endpoint_local;
  cio_server_socket *server_socket_local;
  
  if (server_socket == (cio_server_socket *)0x0 || endpoint == (cio_socket_address *)0x0) {
    server_socket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else if ((endpoint->impl).sa.socket_address.addr.sa_family == 0) {
    server_socket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    _Var1 = is_standard_uds_socket(endpoint);
    if ((!_Var1) ||
       (server_socket_local._4_4_ = try_removing_uds_file(endpoint),
       server_socket_local._4_4_ == CIO_SUCCESS)) {
      iVar2 = bind((server_socket->impl).ev.fd,(sockaddr *)&(endpoint->impl).sa.socket_address,
                   (endpoint->impl).len);
      if (iVar2 == 0) {
        server_socket_local._4_4_ = CIO_SUCCESS;
      }
      else {
        piVar3 = __errno_location();
        server_socket_local._4_4_ = -*piVar3;
      }
    }
  }
  return server_socket_local._4_4_;
}

Assistant:

enum cio_error cio_server_socket_bind(struct cio_server_socket *server_socket, const struct cio_socket_address *endpoint)
{
	if (cio_unlikely((server_socket == NULL) || (endpoint == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely((enum cio_address_family)endpoint->impl.sa.socket_address.addr.sa_family == CIO_ADDRESS_FAMILY_UNSPEC)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (is_standard_uds_socket(endpoint)) {
		enum cio_error err = try_removing_uds_file(endpoint);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			return err;
		}
	}

	const struct sockaddr *addr = &endpoint->impl.sa.socket_address.addr;
	socklen_t addr_len = endpoint->impl.len;

	int ret = bind(server_socket->impl.ev.fd, addr, addr_len);
	if (cio_unlikely(ret != 0)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}